

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

void shuffle(int *a,int n,int n2,int *tmp)

{
  int iVar1;
  int *pt;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  if (1 < n) {
    piVar2 = a + n2;
    iVar1 = n2 * 2;
    lVar4 = 0;
    piVar3 = piVar2;
    do {
      *(int *)((long)tmp + lVar4 * 2) = *piVar3;
      piVar3 = piVar3 + iVar1;
      iVar5 = (int)lVar4;
      lVar4 = lVar4 + 2;
    } while (iVar5 + 3 < n);
    if (n != 2) {
      piVar3 = a + iVar1;
      iVar5 = 2;
      do {
        *piVar2 = *piVar3;
        iVar5 = iVar5 + 2;
        piVar3 = piVar3 + iVar1;
        piVar2 = piVar2 + n2;
      } while (iVar5 < n);
    }
    if (1 < n) {
      lVar4 = 0;
      do {
        *piVar2 = *(int *)((long)tmp + lVar4 * 2);
        piVar2 = piVar2 + n2;
        iVar1 = (int)lVar4;
        lVar4 = lVar4 + 2;
      } while (iVar1 + 3 < n);
    }
  }
  return;
}

Assistant:

static void
shuffle(int a[], int n, int n2, int tmp[])
{

/* 
int a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
int tmp[];	 scratch storage					
*/

int i;
int *p1, *p2, *pt;

	/*
	 * copy odd elements to tmp
	 */
	pt = tmp;
	p1 = &a[n2];
	for (i=1; i < n; i += 2) {
		*pt = *p1;
		pt += 1;
		p1 += (n2+n2);
	}
	/*
	 * compress even elements into first half of A
	 */
	p1 = &a[n2];
	p2 = &a[n2+n2];
	for (i=2; i<n; i += 2) {
		*p1 = *p2;
		p1 += n2;
		p2 += (n2+n2);
	}
	/*
	 * put odd elements into 2nd half
	 */
	pt = tmp;
	for (i = 1; i<n; i += 2) {
		*p1 = *pt;
		p1 += n2;
		pt += 1;
	}
}